

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_hashtable.cc
# Opt level: O1

void __thiscall PF_HashTable::~PF_HashTable(PF_HashTable *this)

{
  PF_HashEntry *pPVar1;
  PF_HashEntry *pPVar2;
  long lVar3;
  
  if (0 < this->numBuckets) {
    lVar3 = 0;
    do {
      pPVar2 = this->hashTable[lVar3];
      while (pPVar2 != (PF_HashEntry *)0x0) {
        pPVar1 = pPVar2->next;
        operator_delete(pPVar2);
        pPVar2 = pPVar1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->numBuckets);
  }
  if (this->hashTable == (PF_HashEntry **)0x0) {
    return;
  }
  operator_delete__(this->hashTable);
  return;
}

Assistant:

PF_HashTable::~PF_HashTable()
{
  // Clear out all buckets
  for (int i = 0; i < numBuckets; i++) {

    // Delete all entries in the bucket
    PF_HashEntry *entry = hashTable[i];
    while (entry != NULL) {
      PF_HashEntry *next = entry->next;
      delete entry;
      entry = next;
    }
  }

  // Finally delete the hash table
  delete[] hashTable;
}